

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O3

uchar * stbi__load_flip(stbi__context *s,int *x,int *y,int *comp,int req_comp)

{
  uchar uVar1;
  int iVar2;
  uchar *puVar3;
  int iVar4;
  long lVar5;
  uint uVar6;
  ulong uVar7;
  uchar *puVar8;
  long lVar9;
  ulong uVar10;
  uchar *puVar11;
  uchar *puVar12;
  
  puVar3 = stbi__load_main(s,x,y,comp,req_comp);
  if ((puVar3 != (uchar *)0x0) && (stbi__vertically_flip_on_load != 0)) {
    if (req_comp == 0) {
      req_comp = *comp;
    }
    uVar6 = *y >> 1;
    if (0 < (int)uVar6) {
      iVar2 = *x;
      lVar5 = (long)req_comp;
      iVar4 = (*y + -1) * iVar2;
      uVar7 = 0;
      puVar8 = puVar3;
      do {
        if (0 < iVar2) {
          puVar11 = puVar3 + iVar4 * lVar5;
          lVar9 = 0;
          puVar12 = puVar8;
          do {
            if (0 < req_comp) {
              uVar10 = 0;
              do {
                uVar1 = puVar12[uVar10];
                puVar12[uVar10] = puVar11[uVar10];
                puVar11[uVar10] = uVar1;
                uVar10 = uVar10 + 1;
              } while ((uint)req_comp != uVar10);
            }
            lVar9 = lVar9 + 1;
            puVar11 = puVar11 + lVar5;
            puVar12 = puVar12 + lVar5;
          } while (lVar9 != iVar2);
        }
        uVar7 = uVar7 + 1;
        iVar4 = iVar4 - iVar2;
        puVar8 = puVar8 + lVar5 * iVar2;
      } while (uVar7 != uVar6);
    }
  }
  return puVar3;
}

Assistant:

static unsigned char *stbi__load_flip(stbi__context *s, int *x, int *y, int *comp, int req_comp)
{
   unsigned char *result = stbi__load_main(s, x, y, comp, req_comp);

   if (stbi__vertically_flip_on_load && result != NULL) {
      int w = *x, h = *y;
      int depth = req_comp ? req_comp : *comp;
      int row,col,z;
      stbi_uc temp;

      // @OPTIMIZE: use a bigger temp buffer and memcpy multiple pixels at once
      for (row = 0; row < (h>>1); row++) {
         for (col = 0; col < w; col++) {
            for (z = 0; z < depth; z++) {
               temp = result[(row * w + col) * depth + z];
               result[(row * w + col) * depth + z] = result[((h - row - 1) * w + col) * depth + z];
               result[((h - row - 1) * w + col) * depth + z] = temp;
            }
         }
      }
   }

   return result;
}